

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  Column *col;
  ostream *poVar2;
  char *pcVar3;
  ostream *poVar4;
  TablePrinter *extraout_RAX;
  Column local_c0;
  reference local_90;
  ColumnInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *__range3;
  undefined1 local_60 [8];
  Spacer spacer;
  Columns headerCols;
  TablePrinter *this_local;
  
  if ((this->m_isOpen & 1U) == 0) {
    this->m_isOpen = true;
    Catch::operator<<();
    clara::TextFlow::Columns::Columns((Columns *)&spacer.super_Column.m_initialIndent);
    clara::TextFlow::Spacer::Spacer((Spacer *)local_60,2);
    __end3 = clara::std::
             vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
             ::begin(&this->m_columnInfos);
    info = (ColumnInfo *)
           clara::std::
           vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ::end(&this->m_columnInfos);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                                  *)&info);
      if (!bVar1) break;
      local_90 = __gnu_cxx::
                 __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                 ::operator*(&__end3);
      clara::TextFlow::Column::Column(&local_c0,&local_90->name);
      col = clara::TextFlow::Column::width(&local_c0,(long)(local_90->width + -2));
      clara::TextFlow::Columns::operator+=((Columns *)&spacer.super_Column.m_initialIndent,col);
      clara::TextFlow::Column::~Column(&local_c0);
      clara::TextFlow::Columns::operator+=
                ((Columns *)&spacer.super_Column.m_initialIndent,(Column *)local_60);
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator++(&__end3);
    }
    poVar2 = clara::TextFlow::operator<<(this->m_os,(Columns *)&spacer.super_Column.m_initialIndent)
    ;
    std::operator<<((ostream *)poVar2,'\n');
    poVar4 = (ostream *)this->m_os;
    pcVar3 = getLineOfChars<(char)45>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    std::operator<<(poVar4,'\n');
    clara::TextFlow::Spacer::~Spacer((Spacer *)local_60);
    clara::TextFlow::Columns::~Columns((Columns *)&spacer.super_Column.m_initialIndent);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			Columns headerCols;
			Spacer spacer(2);
			for (auto const& info : m_columnInfos) {
				headerCols += Column(info.name).width(static_cast<std::size_t>(info.width - 2));
				headerCols += spacer;
			}
			m_os << headerCols << '\n';

            m_os << Catch::getLineOfChars<'-'>() << '\n';
        }
    }